

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode Curl_parse_port(Curl_URL *u,char *hostname)

{
  int iVar1;
  char *pcVar2;
  char local_4f [7];
  long lStack_48;
  char portbuf [7];
  long port;
  char *rest;
  int local_30;
  int zonelen;
  int len;
  char endbracket;
  char *portptr;
  char *hostname_local;
  Curl_URL *u_local;
  
  _len = (char *)0x0;
  portptr = hostname;
  hostname_local = (char *)u;
  iVar1 = __isoc99_sscanf(hostname,"[%*45[0123456789abcdefABCDEF:.]%c%n",(long)&zonelen + 3,
                          &local_30);
  if (iVar1 == 1) {
    if (zonelen._3_1_ == ']') {
      _len = portptr + local_30;
    }
    else {
      if (zonelen._3_1_ != '%') {
        return CURLUE_MALFORMED_INPUT;
      }
      rest._4_4_ = local_30;
      iVar1 = __isoc99_sscanf(portptr + local_30,"%*[^]]%c%n",(long)&zonelen + 3,&local_30);
      if (iVar1 != 1) {
        return CURLUE_MALFORMED_INPUT;
      }
      if (zonelen._3_1_ != ']') {
        return CURLUE_MALFORMED_INPUT;
      }
      rest._4_4_ = rest._4_4_ + -1;
      _len = portptr + (rest._4_4_ + local_30 + 1);
    }
    if ((_len == (char *)0x0) || (*_len == '\0')) {
      _len = (char *)0x0;
    }
    else if (*_len != ':') {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  else {
    _len = strchr(portptr,0x3a);
  }
  if (_len != (char *)0x0) {
    if (_len[1] == '\0') {
      *_len = '\0';
      return CURLUE_OK;
    }
    iVar1 = Curl_isdigit((uint)(byte)_len[1]);
    if (iVar1 == 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    lStack_48 = strtol(_len + 1,(char **)&port,10);
    if ((lStack_48 < 1) || (0xffff < lStack_48)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*(char *)port != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    *_len = '\0';
    *(undefined1 *)port = 0;
    _len = _len + 1;
    curl_msnprintf(local_4f,7,"%ld",lStack_48);
    *(long *)(hostname_local + 0x58) = lStack_48;
    pcVar2 = (*Curl_cstrdup)(local_4f);
    *(char **)(hostname_local + 0x30) = pcVar2;
    if (*(long *)(hostname_local + 0x30) == 0) {
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  return CURLUE_OK;
}

Assistant:

UNITTEST CURLUcode Curl_parse_port(struct Curl_URL *u, char *hostname)
{
  char *portptr = NULL;
  char endbracket;
  int len;

  /*
   * Find the end of an IPv6 address, either on the ']' ending bracket or
   * a percent-encoded zone index.
   */
  if(1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.]%c%n",
                 &endbracket, &len)) {
    if(']' == endbracket)
      portptr = &hostname[len];
    else if('%' == endbracket) {
      int zonelen = len;
      if(1 == sscanf(hostname + zonelen, "%*[^]]%c%n", &endbracket, &len)) {
        if(']' != endbracket)
          return CURLUE_MALFORMED_INPUT;
        portptr = &hostname[--zonelen + len + 1];
      }
      else
        return CURLUE_MALFORMED_INPUT;
    }
    else
      return CURLUE_MALFORMED_INPUT;

    /* this is a RFC2732-style specified IP-address */
    if(portptr && *portptr) {
      if(*portptr != ':')
        return CURLUE_MALFORMED_INPUT;
    }
    else
      portptr = NULL;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];

    /* Browser behavior adaptation. If there's a colon with no digits after,
       just cut off the name there which makes us ignore the colon and just
       use the default port. Firefox, Chrome and Safari all do that. */
    if(!portptr[1]) {
      *portptr = '\0';
      return CURLUE_OK;
    }

    if(!ISDIGIT(portptr[1]))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port <= 0) || (port > 0xffff))
      /* Single unix standard says port numbers are 16 bits long, but we don't
         treat port zero as OK. */
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    *portptr++ = '\0'; /* cut off the name there */
    *rest = 0;
    /* generate a new port number string to get rid of leading zeroes etc */
    msnprintf(portbuf, sizeof(portbuf), "%ld", port);
    u->portnum = port;
    u->port = strdup(portbuf);
    if(!u->port)
      return CURLUE_OUT_OF_MEMORY;
  }

  return CURLUE_OK;
}